

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

void __thiscall
QSocks5SocketEnginePrivate::parseRequestMethodReply(QSocks5SocketEnginePrivate *this)

{
  byte bVar1;
  QAbstractSocketEngine *this_00;
  Socks5State state;
  int iVar2;
  long in_FS_OFFSET;
  int pos;
  QArrayDataPointer<char16_t> local_78;
  quint16 port;
  QHostAddress address;
  QArrayDataPointer<char> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketEngine **)&(this->super_QAbstractSocketEnginePrivate).field_0x8;
  local_48.size = 0;
  local_48.d = (Data *)0x0;
  local_48.ptr = (char *)0x0;
  QSocks5Authenticator::unSeal
            ((QSocks5Authenticator *)this,this->data->controlSocket,(QByteArray *)&local_48);
  QByteArray::prepend((QByteArray *)&local_48);
  QByteArray::clear();
  if ((ulong)local_48.size < 3) {
    QByteArray::operator=(&this->receivedHeaderFragment,(QByteArray *)&local_48);
    goto LAB_0021fd35;
  }
  address.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QHostAddress::QHostAddress(&address);
  port = 0;
  if ((*local_48.ptr == '\x05') && (local_48.ptr[2] == '\0')) {
    bVar1 = local_48.ptr[1];
    if (bVar1 != 0) {
      if ((bVar1 < 3) && ((this->peerName).d.size != 0)) {
        state = HostNameLookupError;
        goto LAB_0021fc09;
      }
      setErrorState(this,RequestError,(int)(char)bVar1);
      goto LAB_0021fc1d;
    }
    pos = 3;
    iVar2 = qt_socks5_get_host_address_and_port((QByteArray *)&local_48,&address,&port,&pos);
    if (iVar2 != 0) {
      if (iVar2 == -1) goto LAB_0021fbf6;
      QByteArray::remove((longlong)&local_48,0);
      iVar2 = (int)local_48.size;
      while( true ) {
        iVar2 = iVar2 + -1;
        if (iVar2 < 0) break;
        QIODevice::ungetChar((char)this->data->controlSocket);
      }
      goto LAB_0021fc1d;
    }
    QByteArray::operator=(&this->receivedHeaderFragment,(QByteArray *)&local_48);
  }
  else {
LAB_0021fbf6:
    state = SocksError;
LAB_0021fc09:
    local_78.size = 0;
    local_78.ptr = (char16_t *)0x0;
    local_78.d = (Data *)0x0;
    setErrorState(this,state,(QString *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
LAB_0021fc1d:
    if (this->socks5State == BindSuccess) {
      QHostAddress::operator=(&this->bindData->peerAddress,&address);
      this->bindData->peerPort = port;
      emitReadNotification(this);
    }
    else if (this->socks5State == RequestMethodSent) {
      QHostAddress::operator=(&(this->super_QAbstractSocketEnginePrivate).localAddress,&address);
      (this->super_QAbstractSocketEnginePrivate).localPort = port;
      if (this->mode == BindMode) {
        this->socks5State = BindSuccess;
        QAbstractSocketEngine::setState(this_00,ListeningState);
      }
      else {
        if (this->mode == ConnectMode) {
          (this->super_QAbstractSocketEnginePrivate).inboundStreamCount = 1;
          (this->super_QAbstractSocketEnginePrivate).outboundStreamCount = 1;
          this->socks5State = Connected;
          QAbstractSocketEngine::setState(this_00,ConnectedState);
          goto LAB_0021fccd;
        }
        this->socks5State = UdpAssociateSuccess;
      }
    }
    else {
      (**(code **)(*(long *)&this->data->controlSocket->super_QAbstractSocket + 0x70))();
LAB_0021fccd:
      emitConnectionNotification(this);
    }
  }
  QHostAddress::~QHostAddress(&address);
LAB_0021fd35:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSocks5SocketEnginePrivate::parseRequestMethodReply()
{
    Q_Q(QSocks5SocketEngine);
    QSOCKS5_DEBUG << "parseRequestMethodReply()";

    QByteArray inBuf;
    if (!data->authenticator->unSeal(data->controlSocket, &inBuf)) {
        // ### check error and not just not enough data
        QSOCKS5_DEBUG << "unSeal failed, needs more data";
        return;
    }

    inBuf.prepend(receivedHeaderFragment);
    receivedHeaderFragment.clear();
    QSOCKS5_DEBUG << dump(inBuf);
    if (inBuf.size() < 3) {
        QSOCKS5_DEBUG << "need more data for request reply header .. put this data somewhere";
        receivedHeaderFragment = inBuf;
        return;
    }

    QHostAddress address;
    quint16 port = 0;

    if (inBuf.at(0) != S5_VERSION_5 || inBuf.at(2) != 0x00) {
        QSOCKS5_DEBUG << "socks protocol error";
        setErrorState(SocksError);
    } else if (inBuf.at(1) != S5_SUCCESS) {
        Socks5Error socks5Error = Socks5Error(inBuf.at(1));
        QSOCKS5_DEBUG <<  "Request error :" << socks5Error;
        if ((socks5Error == SocksFailure || socks5Error == ConnectionNotAllowed)
            && !peerName.isEmpty()) {
            // Dante seems to use this error code to indicate hostname resolution failure
            setErrorState(HostNameLookupError);
        } else {
            setErrorState(RequestError, socks5Error);
        }
    } else {
        // connection success, retrieve the remote addresses
        int pos = 3;
        int err = qt_socks5_get_host_address_and_port(inBuf, &address, &port, &pos);
        if (err == -1) {
            QSOCKS5_DEBUG << "error getting address";
            setErrorState(SocksError);
        } else if (err == 0) {
            //need more data
            receivedHeaderFragment = inBuf;
            return;
        } else {
            inBuf.remove(0, pos);
            for (int i = inBuf.size() - 1; i >= 0 ; --i)
                data->controlSocket->ungetChar(inBuf.at(i));
        }
    }

    if (socks5State == RequestMethodSent) {
        // no error
        localAddress = address;
        localPort = port;

        if (mode == ConnectMode) {
            inboundStreamCount = outboundStreamCount = 1;
            socks5State = Connected;
            // notify the upper layer that we're done
            q->setState(QAbstractSocket::ConnectedState);
            emitConnectionNotification();
        } else if (mode == BindMode) {
            socks5State = BindSuccess;
            q->setState(QAbstractSocket::ListeningState);
        } else {
            socks5State = UdpAssociateSuccess;
        }
    } else if (socks5State == BindSuccess) {
        // no error and we got a connection
        bindData->peerAddress = address;
        bindData->peerPort = port;

        emitReadNotification();
    } else {
        // got an error
        data->controlSocket->close();
        emitConnectionNotification();
    }
}